

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

void __thiscall wasm::WasmBinaryWriter::writeElementSegments(WasmBinaryWriter *this)

{
  Module *wasm;
  pointer puVar1;
  ElementSegment *pEVar2;
  char *pcVar3;
  pointer ppEVar4;
  BufferWithRandomAccess *pBVar5;
  int32_t iVar6;
  uint32_t uVar7;
  Table *pTVar8;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  size_t in_RCX;
  void *pvVar11;
  void *__buf;
  void *extraout_RDX;
  void *__buf_00;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *pvVar12;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *__buf_01;
  void *extraout_RDX_05;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  iterator __end3;
  pointer puVar13;
  iterator __begin3;
  pointer ppEVar14;
  long lVar15;
  bool bVar16;
  undefined1 local_90 [8];
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> needingElemDecl;
  LEB<unsigned_int,_unsigned_char> local_58;
  int32_t local_54;
  pointer local_50;
  undefined1 auStack_48 [8];
  Name name;
  
  wasm = this->wasm;
  puVar13 = (wasm->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  puVar1 = (wasm->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  TableUtils::getFunctionsNeedingElemDeclare
            ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)local_90,wasm);
  lVar15 = (ulong)(CONCAT44(needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
                            _4_4_,needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_header.
                                  _M_right._0_4_) != 0) + ((long)puVar13 - (long)puVar1 >> 3);
  if (lVar15 != 0) {
    iVar6 = startSection<wasm::BinaryConsts::Section>(this,Element);
    auStack_48._0_4_ = (int)lVar15;
    LEB<unsigned_int,_unsigned_char>::write
              ((LEB<unsigned_int,_unsigned_char> *)auStack_48,(int)this->o,__buf,in_RCX);
    puVar13 = (this->wasm->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)(this->wasm->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    pvVar11 = extraout_RDX;
    local_54 = iVar6;
    if (puVar13 != (pointer)needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      do {
        pEVar2 = (puVar13->_M_t).
                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                 .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        pcVar3 = *(char **)((long)&(pEVar2->table).super_IString + 8);
        name.super_IString.str._M_str._7_1_ = TableUtils::usesExpressions(pEVar2,this->wasm);
        if (pcVar3 == (char *)0x0) {
          bVar16 = false;
          local_50 = (pointer)((ulong)local_50 & 0xffffffff00000000);
        }
        else {
          uVar7 = getTableIndex(this,(Name)(((puVar13->_M_t).
                                             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                            _M_head_impl)->table).super_IString.str);
          bVar16 = true;
          local_50 = (pointer)CONCAT44(local_50._4_4_,uVar7);
          if (uVar7 == 0) {
            pTVar8 = Module::getTable(this->wasm,
                                      (Name)(((puVar13->_M_t).
                                              super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                              .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                             _M_head_impl)->table).super_IString.str);
            bVar16 = (pTVar8->type).id != 0x12;
          }
        }
        pvVar11 = (void *)(ulong)((uint)name.super_IString.str._M_str._7_1_ * 4 + 2);
        if (!bVar16) {
          pvVar11 = (void *)((ulong)name.super_IString.str._M_str._7_1_ << 2);
        }
        pvVar12 = (void *)(ulong)((uint)name.super_IString.str._M_str._7_1_ * 4 + 1);
        if (pcVar3 != (char *)0x0) {
          pvVar12 = pvVar11;
        }
        auStack_48._0_4_ = (int)pvVar12;
        LEB<unsigned_int,_unsigned_char>::write
                  ((LEB<unsigned_int,_unsigned_char> *)auStack_48,(int)this->o,pvVar12,
                   (size_t)pvVar11);
        pvVar12 = __buf_00;
        if (pcVar3 == (char *)0x0) {
LAB_00c7308b:
          if (name.super_IString.str._M_str._7_1_ == 0) {
            auStack_48 = (undefined1  [8])((ulong)auStack_48 & 0xffffffff00000000);
            LEB<unsigned_int,_unsigned_char>::write
                      ((LEB<unsigned_int,_unsigned_char> *)auStack_48,(int)this->o,pvVar12,
                       (size_t)pvVar11);
            pvVar12 = extraout_RDX_02;
          }
          else {
            writeType(this,(Type)(((puVar13->_M_t).
                                   super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                   .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                  _M_head_impl)->type).id);
            pvVar12 = extraout_RDX_01;
          }
        }
        else {
          if (bVar16) {
            auStack_48._0_4_ = local_50._0_4_;
            LEB<unsigned_int,_unsigned_char>::write
                      ((LEB<unsigned_int,_unsigned_char> *)auStack_48,(int)this->o,__buf_00,
                       (size_t)pvVar11);
          }
          writeExpression(this,((puVar13->_M_t).
                                super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)
                               ->offset);
          auStack_48[0] = 0xb;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                     (uchar *)auStack_48);
          pvVar12 = extraout_RDX_00;
          if (bVar16) goto LAB_00c7308b;
        }
        pEVar2 = (puVar13->_M_t).
                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                 .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        in_RCX = (ulong)((long)*(pointer *)
                                ((long)&(pEVar2->data).
                                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                + 8) -
                        *(long *)&(pEVar2->data).
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl) >> 3;
        auStack_48._0_4_ = (int)in_RCX;
        LEB<unsigned_int,_unsigned_char>::write
                  ((LEB<unsigned_int,_unsigned_char> *)auStack_48,(int)this->o,pvVar12,in_RCX);
        pEVar2 = (puVar13->_M_t).
                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                 .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        ppEVar14 = *(pointer *)
                    &(pEVar2->data).
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl;
        ppEVar4 = *(pointer *)
                   ((long)&(pEVar2->data).
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                   + 8);
        pvVar11 = extraout_RDX_03;
        local_50 = puVar13;
        if (name.super_IString.str._M_str._7_1_ == 0) {
          for (; ppEVar14 != ppEVar4; ppEVar14 = ppEVar14 + 1) {
            if ((*ppEVar14)->_id != RefFuncId) {
              __assert_fail("int(_id) == int(T::SpecificId)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                            ,0x31b,"T *wasm::Expression::cast() [T = wasm::RefFunc]");
            }
            pBVar5 = this->o;
            uVar7 = getFunctionIndex(this,(IString)*(IString *)&(*ppEVar14)[1]._id);
            auStack_48._0_4_ = uVar7;
            LEB<unsigned_int,_unsigned_char>::write
                      ((LEB<unsigned_int,_unsigned_char> *)auStack_48,(int)pBVar5,__buf_01,in_RCX);
            pvVar11 = extraout_RDX_05;
          }
        }
        else {
          for (; ppEVar14 != ppEVar4; ppEVar14 = ppEVar14 + 1) {
            writeExpression(this,*ppEVar14);
            auStack_48[0] = 0xb;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                       (uchar *)auStack_48);
            pvVar11 = extraout_RDX_04;
          }
        }
        puVar13 = local_50 + 1;
      } while (puVar13 != (pointer)needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
    }
    if (CONCAT44(needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_,
                 needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_) != 0)
    {
      auStack_48._0_4_ = 3;
      LEB<unsigned_int,_unsigned_char>::write
                ((LEB<unsigned_int,_unsigned_char> *)auStack_48,(int)this->o,pvVar11,in_RCX);
      auStack_48._0_4_ = 0;
      LEB<unsigned_int,_unsigned_char>::write
                ((LEB<unsigned_int,_unsigned_char> *)auStack_48,(int)this->o,__buf_02,in_RCX);
      auStack_48._0_4_ = needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_
      ;
      LEB<unsigned_int,_unsigned_char>::write
                ((LEB<unsigned_int,_unsigned_char> *)auStack_48,(int)this->o,__buf_03,in_RCX);
      if (needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
          (_Base_ptr)&needingElemDecl) {
        p_Var10 = needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          auStack_48 = *(undefined1 (*) [8])(p_Var10 + 1);
          name.super_IString.str._M_len = (size_t)p_Var10[1]._M_parent;
          pBVar5 = this->o;
          pmVar9 = std::__detail::
                   _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&this->indexes,(key_type *)auStack_48);
          local_58.value = *pmVar9;
          LEB<unsigned_int,_unsigned_char>::write(&local_58,(int)pBVar5,__buf_04,in_RCX);
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        } while (p_Var10 != (_Rb_tree_node_base *)&needingElemDecl);
      }
    }
    finishSection(this,local_54);
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)local_90);
  return;
}

Assistant:

void WasmBinaryWriter::writeElementSegments() {
  size_t elemCount = wasm->elementSegments.size();
  auto needingElemDecl = TableUtils::getFunctionsNeedingElemDeclare(*wasm);
  if (!needingElemDecl.empty()) {
    elemCount++;
  }
  if (elemCount == 0) {
    return;
  }

  auto start = startSection(BinaryConsts::Section::Element);
  o << U32LEB(elemCount);

  Type funcref = Type(HeapType::func, Nullable);
  for (auto& segment : wasm->elementSegments) {
    Index tableIdx = 0;

    bool isPassive = segment->table.isNull();
    // If the segment is MVP, we can use the shorter form.
    bool usesExpressions = TableUtils::usesExpressions(segment.get(), wasm);

    // The table index can and should be elided for active segments of table 0
    // when table 0 has type funcref. This was the only type of segment
    // supported by the MVP, which also did not support table indices in the
    // segment encoding.
    bool hasTableIndex = false;
    if (!isPassive) {
      tableIdx = getTableIndex(segment->table);
      hasTableIndex =
        tableIdx > 0 || wasm->getTable(segment->table)->type != funcref;
    }

    uint32_t flags = 0;
    if (usesExpressions) {
      flags |= BinaryConsts::UsesExpressions;
    }
    if (isPassive) {
      flags |= BinaryConsts::IsPassive;
    } else if (hasTableIndex) {
      flags |= BinaryConsts::HasIndex;
    }

    o << U32LEB(flags);
    if (!isPassive) {
      if (hasTableIndex) {
        o << U32LEB(tableIdx);
      }
      writeExpression(segment->offset);
      o << int8_t(BinaryConsts::End);
    }

    if (isPassive || hasTableIndex) {
      if (usesExpressions) {
        // elemType
        writeType(segment->type);
      } else {
        // MVP elemKind of funcref
        o << U32LEB(0);
      }
    }
    o << U32LEB(segment->data.size());
    if (usesExpressions) {
      for (auto* item : segment->data) {
        writeExpression(item);
        o << int8_t(BinaryConsts::End);
      }
    } else {
      for (auto& item : segment->data) {
        // We've ensured that all items are ref.func.
        auto& name = item->cast<RefFunc>()->func;
        o << U32LEB(getFunctionIndex(name));
      }
    }
  }

  if (!needingElemDecl.empty()) {
    o << U32LEB(BinaryConsts::IsPassive | BinaryConsts::IsDeclarative);
    o << U32LEB(0); // type (indicating funcref)
    o << U32LEB(needingElemDecl.size());
    for (auto name : needingElemDecl) {
      o << U32LEB(indexes.functionIndexes[name]);
    }
  }

  finishSection(start);
}